

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockHouseholder.h
# Opt level: O0

void Eigen::internal::
     apply_block_householder_on_the_left<Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,_1,false>,Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>,_1,_1,false>,Eigen::VectorBlock<Eigen::Matrix<float,_1,1,0,8,1>const,_1>>
               (Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false> *mat,
               Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false> *vectors,
               VectorBlock<const_Eigen::Matrix<float,__1,_1,_0,_8,_1>,__1> *hCoeffs,bool forward)

{
  Index *x;
  ConjugateReturnType hCoeffs_00;
  Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false> *local_1f0;
  Product<Eigen::TriangularView<const_Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,_5U>,_Eigen::Matrix<float,__1,__1,_0,_8,_1>,_0>
  local_1e8;
  TriangularView<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_2U> local_1a8;
  MatrixTypeNested local_1a0;
  Product<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>_>,_1U>,_Eigen::Matrix<float,__1,__1,_0,_8,_1>,_0>
  local_198;
  MatrixTypeNested local_188;
  Product<Eigen::TriangularView<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_2U>,_Eigen::Matrix<float,__1,__1,_0,_8,_1>,_0>
  local_180;
  AdjointReturnType local_170;
  Product<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>_>,_6U>,_Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_0>
  local_138;
  Matrix<float,_1,_1,0,8,1> local_c8 [8];
  Matrix<float,__1,__1,_0,_8,_1> tmp;
  undefined1 local_90 [8];
  TriangularView<const_Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,_5U> V;
  undefined1 local_48 [8];
  Matrix<float,__1,__1,_1,__1,__1> T;
  Index nbVecs;
  bool forward_local;
  VectorBlock<const_Eigen::Matrix<float,__1,_1,_0,_8,_1>,__1> *hCoeffs_local;
  Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false> *vectors_local;
  Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false> *mat_local;
  
  T.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>.m_storage.m_cols =
       MapBase<Eigen::Block<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_-1,_false>,_0>::cols
                 ((MapBase<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,_0> *)
                  vectors);
  x = &T.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>.m_storage.m_cols;
  Matrix<float,-1,-1,1,-1,-1>::Matrix<long,long>((Matrix<float,_1,_1,1,_1,_1> *)local_48,x,x);
  if (forward) {
    make_block_householder_triangular_factor<Eigen::Matrix<float,_1,_1,1,_1,_1>,Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>,_1,_1,false>,Eigen::VectorBlock<Eigen::Matrix<float,_1,1,0,8,1>const,_1>>
              ((Matrix<float,__1,__1,_1,__1,__1> *)local_48,vectors,hCoeffs);
  }
  else {
    hCoeffs_00 = DenseBase<Eigen::Block<const_Eigen::Matrix<float,_-1,_1,_0,_8,_1>,_-1,_1,_false>_>
                 ::conjugate((DenseBase<Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,_8,_1>,__1,_1,_false>_>
                              *)hCoeffs);
    make_block_householder_triangular_factor<Eigen::Matrix<float,_1,_1,1,_1,_1>,Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>,_1,_1,false>,Eigen::Block<Eigen::Matrix<float,_1,1,0,8,1>const,_1,1,false>>
              ((Matrix<float,__1,__1,_1,__1,__1> *)local_48,vectors,hCoeffs_00);
  }
  TriangularView<const_Eigen::Block<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_-1,_false>,_5U>::
  TriangularView((TriangularView<const_Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,_5U>
                  *)local_90,vectors);
  TriangularView<const_Eigen::Block<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_-1,_false>,_5U>::
  adjoint(&local_170,
          (TriangularView<const_Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,_5U>
           *)local_90);
  TriangularViewImpl<Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,-1,8,0,-1,8>,-1,-1,false>const>const,6u,Eigen::Dense>
  ::operator*(&local_138,
              (TriangularViewImpl<Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>,_1,_1,false>const>const,6u,Eigen::Dense>
               *)&local_170,
              (MatrixBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>_> *)mat
             );
  Matrix<float,-1,-1,0,8,1>::
  Matrix<Eigen::Product<Eigen::TriangularView<Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>,_1,_1,false>const>const,6u>,Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,_1,false>,0>>
            (local_c8,(EigenBase<Eigen::Product<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>_>,_6U>,_Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_0>_>
                       *)&local_138);
  if (forward) {
    local_188 = (MatrixTypeNested)
                MatrixBase<Eigen::Matrix<float,-1,-1,1,-1,-1>>::triangularView<2u>
                          ((MatrixBase<Eigen::Matrix<float,_1,_1,1,_1,_1>> *)local_48);
    local_180 = TriangularViewImpl<Eigen::Matrix<float,-1,-1,1,-1,-1>,2u,Eigen::Dense>::operator*
                          ((TriangularViewImpl<Eigen::Matrix<float,_1,_1,1,_1,_1>,2u,Eigen::Dense> *
                           )&local_188,
                           (MatrixBase<Eigen::Matrix<float,__1,__1,_0,_8,_1>_> *)local_c8);
    Matrix<float,-1,-1,0,8,1>::operator=
              (local_c8,(DenseBase<Eigen::Product<Eigen::TriangularView<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_2U>,_Eigen::Matrix<float,__1,__1,_0,_8,_1>,_0>_>
                         *)&local_180);
  }
  else {
    local_1a8.m_matrix =
         (MatrixTypeNested)
         MatrixBase<Eigen::Matrix<float,-1,-1,1,-1,-1>>::triangularView<2u>
                   ((MatrixBase<Eigen::Matrix<float,_1,_1,1,_1,_1>> *)local_48);
    local_1a0.m_matrix =
         (non_const_type)
         TriangularView<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_2U>::adjoint(&local_1a8);
    local_198 = TriangularViewImpl<Eigen::Transpose<Eigen::Matrix<float,-1,-1,1,-1,-1>const>const,1u,Eigen::Dense>
                ::operator*((TriangularViewImpl<Eigen::Transpose<Eigen::Matrix<float,_1,_1,1,_1,_1>const>const,1u,Eigen::Dense>
                             *)&local_1a0,
                            (MatrixBase<Eigen::Matrix<float,__1,__1,_0,_8,_1>_> *)local_c8);
    Matrix<float,-1,-1,0,8,1>::operator=
              (local_c8,(DenseBase<Eigen::Product<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>_>,_1U>,_Eigen::Matrix<float,__1,__1,_0,_8,_1>,_0>_>
                         *)&local_198);
  }
  TriangularViewImpl<Eigen::Block<Eigen::Matrix<float,-1,8,0,-1,8>,-1,-1,false>const,5u,Eigen::Dense>
  ::operator*(&local_1e8,
              (TriangularViewImpl<Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>,_1,_1,false>const,5u,Eigen::Dense>
               *)local_90,(MatrixBase<Eigen::Matrix<float,__1,__1,_0,_8,_1>_> *)local_c8);
  local_1f0 = (Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false> *)
              MatrixBase<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>_>::
              noalias((MatrixBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>_>
                       *)mat);
  NoAlias<Eigen::Block<Eigen::Matrix<float,-1,1,0,-1,1>,-1,-1,false>,Eigen::MatrixBase>::operator-=
            ((NoAlias<Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,_1,false>,Eigen::MatrixBase>
              *)&local_1f0,
             (MatrixBase<Eigen::Product<Eigen::TriangularView<const_Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,_5U>,_Eigen::Matrix<float,__1,__1,_0,_8,_1>,_0>_>
              *)&local_1e8);
  Matrix<float,_-1,_-1,_1,_-1,_-1>::~Matrix((Matrix<float,__1,__1,_1,__1,__1> *)local_48);
  return;
}

Assistant:

void apply_block_householder_on_the_left(MatrixType& mat, const VectorsType& vectors, const CoeffsType& hCoeffs, bool forward)
{
  enum { TFactorSize = MatrixType::ColsAtCompileTime };
  Index nbVecs = vectors.cols();
  Matrix<typename MatrixType::Scalar, TFactorSize, TFactorSize, RowMajor> T(nbVecs,nbVecs);
  
  if(forward) make_block_householder_triangular_factor(T, vectors, hCoeffs);
  else        make_block_householder_triangular_factor(T, vectors, hCoeffs.conjugate());  
  const TriangularView<const VectorsType, UnitLower> V(vectors);

  // A -= V T V^* A
  Matrix<typename MatrixType::Scalar,VectorsType::ColsAtCompileTime,MatrixType::ColsAtCompileTime,
         (VectorsType::MaxColsAtCompileTime==1 && MatrixType::MaxColsAtCompileTime!=1)?RowMajor:ColMajor,
         VectorsType::MaxColsAtCompileTime,MatrixType::MaxColsAtCompileTime> tmp = V.adjoint() * mat;
  // FIXME add .noalias() once the triangular product can work inplace
  if(forward) tmp = T.template triangularView<Upper>()           * tmp;
  else        tmp = T.template triangularView<Upper>().adjoint() * tmp;
  mat.noalias() -= V * tmp;
}